

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticBeamFundamentalParameter.h
# Opt level: O1

void __thiscall
DIS::AcousticBeamData::setFundamentalDataParameters
          (AcousticBeamData *this,AcousticBeamFundamentalParameter *pX)

{
  unsigned_short uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  (this->_fundamentalDataParameters)._deBeamwidth = pX->_deBeamwidth;
  uVar1 = pX->_scanPattern;
  fVar2 = pX->_beamCenterAzimuth;
  fVar3 = pX->_azimuthalBeamwidth;
  fVar4 = pX->_beamCenterDE;
  (this->_fundamentalDataParameters)._activeEmissionParameterIndex =
       pX->_activeEmissionParameterIndex;
  (this->_fundamentalDataParameters)._scanPattern = uVar1;
  (this->_fundamentalDataParameters)._beamCenterAzimuth = fVar2;
  (this->_fundamentalDataParameters)._azimuthalBeamwidth = fVar3;
  (this->_fundamentalDataParameters)._beamCenterDE = fVar4;
  return;
}

Assistant:

class OPENDIS6_EXPORT AcousticBeamFundamentalParameter
{
protected:
  /** parameter index */
  unsigned short _activeEmissionParameterIndex; 

  /** scan pattern */
  unsigned short _scanPattern; 

  /** beam center azimuth */
  float _beamCenterAzimuth; 

  /** azimuthal beamwidth */
  float _azimuthalBeamwidth; 

  /** beam center */
  float _beamCenterDE; 

  /** DE beamwidth (vertical beamwidth) */
  float _deBeamwidth; 


 public:
    AcousticBeamFundamentalParameter();
    virtual ~AcousticBeamFundamentalParameter();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getActiveEmissionParameterIndex() const; 
    void setActiveEmissionParameterIndex(unsigned short pX); 

    unsigned short getScanPattern() const; 
    void setScanPattern(unsigned short pX); 

    float getBeamCenterAzimuth() const; 
    void setBeamCenterAzimuth(float pX); 

    float getAzimuthalBeamwidth() const; 
    void setAzimuthalBeamwidth(float pX); 

    float getBeamCenterDE() const; 
    void setBeamCenterDE(float pX); 

    float getDeBeamwidth() const; 
    void setDeBeamwidth(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const AcousticBeamFundamentalParameter& rhs) const;
}